

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

bool duckdb::StringUtil::CIEquals(char *l1,idx_t l1_size,char *l2,idx_t l2_size)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  if (l1_size != l2_size) {
    return false;
  }
  if (l1_size != 0) {
    lVar1 = 0;
    do {
      bVar2 = ASCII_TO_LOWER_MAP[(byte)l1[lVar1]] == ASCII_TO_LOWER_MAP[(byte)l2[lVar1]];
      if (!bVar2) {
        return bVar2;
      }
      bVar3 = l1_size - 1 != lVar1;
      lVar1 = lVar1 + 1;
    } while (bVar3);
    return bVar2;
  }
  return true;
}

Assistant:

bool StringUtil::CIEquals(const char *l1, idx_t l1_size, const char *l2, idx_t l2_size) {
	if (l1_size != l2_size) {
		return false;
	}
	const auto charmap = ASCII_TO_LOWER_MAP;
	for (idx_t c = 0; c < l1_size; c++) {
		if (charmap[(uint8_t)l1[c]] != charmap[(uint8_t)l2[c]]) {
			return false;
		}
	}
	return true;
}